

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

void __thiscall cppcms::filters::strftime::operator()(strftime *this,ostream *out)

{
  ostringstream ss;
  add_ftime<char> local_1b0;
  long local_190 [47];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::ios::copyfmt((ios *)((ostringstream *)local_190 + *(long *)(local_190[0] + -0x18)));
  if ((this->tz_)._M_string_length != 0) {
    booster::locale::as::time_zone((set_timezone *)&local_1b0,&this->tz_);
    booster::locale::as::details::operator<<
              ((basic_ostream<char,_std::char_traits<char>_> *)local_190,(set_timezone *)&local_1b0)
    ;
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  booster::locale::as::datetime
            ((ios_base *)((ostringstream *)local_190 + *(long *)(local_190[0] + -0x18)));
  booster::locale::as::ftime<char>(&local_1b0,&this->format_);
  booster::locale::as::details::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)local_190,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  (*(this->time_).to_stream_)((ostream *)local_190,(this->time_).ptr_);
  std::__cxx11::stringbuf::str();
  std::operator<<(out,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return;
}

Assistant:

void strftime::operator()(std::ostream &out) const
	{
		std::ostringstream ss;
		ss.copyfmt(out);
		if(!tz_.empty())
			ss << cppcms::locale::as::time_zone(tz_);
		ss << cppcms::locale::as::datetime << cppcms::locale::as::ftime(format_);
		time_(ss);
		out << ss.str();
	}